

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall google::protobuf::internal::SerialArena::CleanupList(SerialArena *this)

{
  CleanupNode *pCVar1;
  Block *this_00;
  CleanupNode *pCVar2;
  
  this_00 = this->head_;
  this_00->start = (CleanupNode *)this->limit_;
  do {
    pCVar1 = (CleanupNode *)Block::Pointer(this_00,this_00->size & 0xfffffffffffffff8);
    pCVar2 = this_00->start;
    if ((pCVar1 != pCVar2 && -1 < (long)pCVar1 - (long)pCVar2) && pCVar2 < pCVar1) {
      do {
        (*pCVar2->cleanup)(pCVar2->elem);
        pCVar2 = pCVar2 + 1;
      } while (pCVar2 < pCVar1);
    }
    this_00 = this_00->next;
  } while (this_00 != (Block *)0x0);
  return;
}

Assistant:

void SerialArena::CleanupList() {
  Block* b = head_;
  b->start = reinterpret_cast<CleanupNode*>(limit_);
  do {
    auto* limit = reinterpret_cast<CleanupNode*>(
        b->Pointer(b->size & static_cast<size_t>(-8)));
    auto it = b->start;
    auto num = limit - it;
    if (num > 0) {
      for (; it < limit; it++) {
        it->cleanup(it->elem);
      }
    }
    b = b->next;
  } while (b);
}